

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int luaV_equalobj(lua_State *L,TValue *t1,TValue *t2)

{
  int iVar1;
  bool local_91;
  TValue *local_90;
  TValue *local_88;
  TValue *local_80;
  TValue *local_78;
  TValue *local_70;
  TValue *local_68;
  TValue *local_60;
  TValue *local_58;
  bool local_41;
  long local_40;
  lua_Integer i2;
  lua_Integer i1;
  TValue *tm;
  TValue *t2_local;
  TValue *t1_local;
  lua_State *L_local;
  
  tm = t2;
  t2_local = t1;
  t1_local = (TValue *)L;
  if ((t1->tt_ & 0x3f) != (t2->tt_ & 0x3f)) {
    if (((t1->tt_ & 0xf) == (t2->tt_ & 0xf)) && ((t1->tt_ & 0xf) == 3)) {
      iVar1 = luaV_tointegerns(t1,&i2,F2Ieq);
      local_41 = false;
      if (iVar1 != 0) {
        iVar1 = luaV_tointegerns(tm,&local_40,F2Ieq);
        local_41 = false;
        if (iVar1 != 0) {
          local_41 = i2 == local_40;
        }
      }
      return (uint)local_41;
    }
    return 0;
  }
  switch(t1->tt_ & 0x3f) {
  case 0:
  case 1:
  case 0x11:
    L_local._4_4_ = 1;
    break;
  case 2:
    L_local._4_4_ = (uint)((t1->value_).gc == (t2->value_).gc);
    break;
  case 3:
    L_local._4_4_ = (uint)((t1->value_).gc == (t2->value_).gc);
    break;
  case 4:
    L_local._4_4_ = (uint)((t1->value_).gc == (t2->value_).gc);
    break;
  case 5:
    if ((t1->value_).gc == (t2->value_).gc) {
      return 1;
    }
    if (L == (lua_State *)0x0) {
      return 0;
    }
    if (*(long *)((t1->value_).f + 0x28) == 0) {
      local_78 = (TValue *)0x0;
    }
    else {
      if ((*(byte *)(*(long *)((t1->value_).f + 0x28) + 10) & 0x20) == 0) {
        local_80 = luaT_gettm(*(Table **)((t1->value_).f + 0x28),TM_EQ,L->l_G->tmname[5]);
      }
      else {
        local_80 = (TValue *)0x0;
      }
      local_78 = local_80;
    }
    i1 = (lua_Integer)local_78;
    if (local_78 == (TValue *)0x0) {
      if (*(long *)((tm->value_).f + 0x28) == 0) {
        local_88 = (TValue *)0x0;
      }
      else {
        if ((*(byte *)(*(long *)((tm->value_).f + 0x28) + 10) & 0x20) == 0) {
          local_90 = luaT_gettm(*(Table **)((tm->value_).f + 0x28),TM_EQ,
                                *(TString **)(*(long *)&t1_local[1].tt_ + 0x140));
        }
        else {
          local_90 = (TValue *)0x0;
        }
        local_88 = local_90;
      }
      i1 = (lua_Integer)local_88;
    }
    goto LAB_00190420;
  default:
    L_local._4_4_ = (uint)((t1->value_).gc == (t2->value_).gc);
    break;
  case 7:
    if ((t1->value_).gc == (t2->value_).gc) {
      return 1;
    }
    if (L == (lua_State *)0x0) {
      return 0;
    }
    if (*(long *)((t1->value_).f + 0x18) == 0) {
      local_58 = (TValue *)0x0;
    }
    else {
      if ((*(byte *)(*(long *)((t1->value_).f + 0x18) + 10) & 0x20) == 0) {
        local_60 = luaT_gettm(*(Table **)((t1->value_).f + 0x18),TM_EQ,L->l_G->tmname[5]);
      }
      else {
        local_60 = (TValue *)0x0;
      }
      local_58 = local_60;
    }
    i1 = (lua_Integer)local_58;
    if (local_58 == (TValue *)0x0) {
      if (*(long *)((tm->value_).f + 0x18) == 0) {
        local_68 = (TValue *)0x0;
      }
      else {
        if ((*(byte *)(*(long *)((tm->value_).f + 0x18) + 10) & 0x20) == 0) {
          local_70 = luaT_gettm(*(Table **)((tm->value_).f + 0x18),TM_EQ,
                                *(TString **)(*(long *)&t1_local[1].tt_ + 0x140));
        }
        else {
          local_70 = (TValue *)0x0;
        }
        local_68 = local_70;
      }
      i1 = (lua_Integer)local_68;
    }
LAB_00190420:
    if (i1 == 0) {
      L_local._4_4_ = 0;
    }
    else {
      luaT_callTMres((lua_State *)t1_local,(TValue *)i1,t2_local,tm,(StkId)t1_local[1].value_.gc);
      local_91 = true;
      if ((t1_local[1].value_.gc)->tt != '\x01') {
        local_91 = ((t1_local[1].value_.gc)->tt & 0xf) == 0;
      }
      L_local._4_4_ = (uint)((local_91 ^ 0xffU) & 1);
    }
    break;
  case 0x13:
    L_local._4_4_ = (uint)((t1->value_).n == (t2->value_).n);
    break;
  case 0x14:
    L_local._4_4_ = luaS_eqlngstr((TString *)(t1->value_).gc,(TString *)(t2->value_).gc);
    break;
  case 0x16:
    L_local._4_4_ = (uint)((t1->value_).gc == (t2->value_).gc);
  }
  return L_local._4_4_;
}

Assistant:

int luaV_equalobj (lua_State *L, const TValue *t1, const TValue *t2) {
  const TValue *tm;
  if (ttypetag(t1) != ttypetag(t2)) {  /* not the same variant? */
    if (ttype(t1) != ttype(t2) || ttype(t1) != LUA_TNUMBER)
      return 0;  /* only numbers can be equal with different variants */
    else {  /* two numbers with different variants */
      /* One of them is an integer. If the other does not have an
         integer value, they cannot be equal; otherwise, compare their
         integer values. */
      lua_Integer i1, i2;
      return (luaV_tointegerns(t1, &i1, F2Ieq) &&
              luaV_tointegerns(t2, &i2, F2Ieq) &&
              i1 == i2);
    }
  }
  /* values have same type and same variant */
  switch (ttypetag(t1)) {
    case LUA_VNIL: case LUA_VFALSE: case LUA_VTRUE: return 1;
    case LUA_VNUMINT: return (ivalue(t1) == ivalue(t2));
    case LUA_VNUMFLT: return luai_numeq(fltvalue(t1), fltvalue(t2));
    case LUA_VLIGHTUSERDATA: return pvalue(t1) == pvalue(t2);
    case LUA_VLCF: return fvalue(t1) == fvalue(t2);
    case LUA_VSHRSTR: return eqshrstr(tsvalue(t1), tsvalue(t2));
    case LUA_VLNGSTR: return luaS_eqlngstr(tsvalue(t1), tsvalue(t2));
    case LUA_VUSERDATA: {
      if (uvalue(t1) == uvalue(t2)) return 1;
      else if (L == NULL) return 0;
      tm = fasttm(L, uvalue(t1)->metatable, TM_EQ);
      if (tm == NULL)
        tm = fasttm(L, uvalue(t2)->metatable, TM_EQ);
      break;  /* will try TM */
    }
    case LUA_VTABLE: {
      if (hvalue(t1) == hvalue(t2)) return 1;
      else if (L == NULL) return 0;
      tm = fasttm(L, hvalue(t1)->metatable, TM_EQ);
      if (tm == NULL)
        tm = fasttm(L, hvalue(t2)->metatable, TM_EQ);
      break;  /* will try TM */
    }
    default:
      return gcvalue(t1) == gcvalue(t2);
  }
  if (tm == NULL)  /* no TM? */
    return 0;  /* objects are different */
  else {
    luaT_callTMres(L, tm, t1, t2, L->top.p);  /* call TM */
    return !l_isfalse(s2v(L->top.p));
  }
}